

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void CTcSymObj::s_gen_code_member
               (int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,vm_obj_id_t obj_id,
               int varargs,CTcNamedArgs *named_args)

{
  short sVar1;
  int iVar2;
  int in_ECX;
  int iVar3;
  undefined4 in_register_0000000c;
  undefined4 in_EDX;
  void *__buf;
  void *__buf_00;
  long *in_RSI;
  int in_EDI;
  undefined4 in_R8D;
  int in_R9D;
  vm_prop_id_t prop;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  
  iVar3 = in_ECX;
  sVar1 = (**(code **)(*in_RSI + 200))(in_RSI,1,in_EDX);
  if ((in_ECX != 0) && (iVar2 = CTcGenTarg::is_speculative(G_cg), iVar2 != 0)) {
    err_throw(0);
  }
  if (sVar1 == 0) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    CTcDataStream::write_obj_id
              ((CTcDataStream *)CONCAT44(in_R8D,in_R9D),
               CONCAT26(sVar1,CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)));
    CTcGenTarg::note_push((CTcGenTarg *)0x27db64);
    if (in_R9D != 0) {
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    }
    (**(code **)(*in_RSI + 200))(in_RSI,0,in_EDX);
    iVar2 = CTcGenTarg::is_speculative(G_cg);
    if (iVar2 == 0) {
      if (in_R9D != 0) {
        CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
        CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      }
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcDataStream::write
                (&G_cs->super_CTcDataStream,(int)(char)in_ECX,__buf_00,
                 CONCAT44(in_register_0000000c,iVar3));
    }
    else {
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    }
    CTcGenTarg::note_pop(G_cg,in_ECX + 2);
  }
  else {
    iVar2 = CTcGenTarg::is_speculative(G_cg);
    if (iVar2 == 0) {
      if (in_ECX == 0) {
        CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
        CTcDataStream::write_obj_id
                  ((CTcDataStream *)CONCAT44(in_R8D,in_R9D),
                   CONCAT26(sVar1,CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)));
        CTcDataStream::write_prop_id
                  ((CTcDataStream *)CONCAT44(in_R8D,in_R9D),
                   CONCAT22(sVar1,in_stack_ffffffffffffffdc));
      }
      else {
        if (in_R9D != 0) {
          CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
        }
        CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
        CTcDataStream::write
                  (&G_cs->super_CTcDataStream,(int)(char)in_ECX,__buf,
                   CONCAT44(in_register_0000000c,iVar3));
        CTcDataStream::write_obj_id
                  ((CTcDataStream *)CONCAT44(in_R8D,in_R9D),
                   CONCAT26(sVar1,CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)));
        CTcDataStream::write_prop_id
                  ((CTcDataStream *)CONCAT44(in_R8D,in_R9D),
                   CONCAT22(sVar1,in_stack_ffffffffffffffdc));
        CTcGenTarg::note_pop(G_cg,in_ECX);
      }
    }
    else {
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcDataStream::write_obj_id
                ((CTcDataStream *)CONCAT44(in_R8D,in_R9D),
                 CONCAT26(sVar1,CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)));
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcDataStream::write_prop_id
                ((CTcDataStream *)CONCAT44(in_R8D,in_R9D),CONCAT22(sVar1,in_stack_ffffffffffffffdc))
      ;
      CTcGenTarg::note_push((CTcGenTarg *)0x27da47);
      CTcGenTarg::note_pop((CTcGenTarg *)0x27da56);
    }
  }
  CTcGenTarg::post_call_cleanup
            ((CTcGenTarg *)CONCAT44(in_R8D,in_R9D),
             (CTcNamedArgs *)
             CONCAT26(sVar1,CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)));
  if (in_EDI == 0) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    CTcGenTarg::note_push((CTcGenTarg *)0x27dc6a);
  }
  return;
}

Assistant:

void CTcSymObj::s_gen_code_member(int discard,
                                  CTcPrsNode *prop_expr, int prop_is_expr,
                                  int argc, vm_obj_id_t obj_id,
                                  int varargs, CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;

    /* 
     *   generate the property expression - don't generate the code right
     *   now even if code generation is necessary, because this isn't the
     *   right place for it; for now, simply check to determine if we're
     *   going to need to generate any code for the property expression 
     */
    prop = prop_expr->gen_code_propid(TRUE, prop_is_expr);

    /* don't allow method calls with arguments in speculative mode */
    if (argc != 0 && G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);
    
    /* check for a constant property value */
    if (prop != VM_INVALID_PROP)
    {
        /* generate an OBJGETPROP or OBJCALLPROP as appropriate */
        if (G_cg->is_speculative())
        {
            /* speculative evaluation - use GETPROPDATA */
            G_cg->write_op(OPC_PUSHOBJ);
            G_cs->write_obj_id(obj_id);
            G_cg->write_op(OPC_GETPROPDATA);
            G_cs->write_prop_id(prop);

            /* we pushed the object, then popped it */
            G_cg->note_push();
            G_cg->note_pop();
        }
        else if (argc == 0)
        {
            /* no arguments - use OBJGETPROP */
            G_cg->write_op(OPC_OBJGETPROP);
            G_cs->write_obj_id(obj_id);
            G_cs->write_prop_id(prop);
        }
        else
        {
            /* generate a varargs modifier if needed */
            if (varargs)
                G_cg->write_op(OPC_VARARGC);
            
            /* arguments - use OBJCALLPROP */
            G_cg->write_op(OPC_OBJCALLPROP);
            G_cs->write((char)argc);
            G_cs->write_obj_id(obj_id);
            G_cs->write_prop_id(prop);

            /* objcallprop removes arguments */
            G_cg->note_pop(argc);
        }
    }
    else
    {
        /* 
         *   non-constant property value - we must first push the object
         *   value, then push the property value, then write a PTRCALLPROP
         *   instruction 
         */

        /* generate the object push */
        G_cg->write_op(OPC_PUSHOBJ);
        G_cs->write_obj_id(obj_id);

        /* note the pushes */
        G_cg->note_push();

        /* keep the argument counter on top if necessary */
        if (varargs)
            G_cg->write_op(OPC_SWAP);

        /* generate the property push */
        prop_expr->gen_code_propid(FALSE, prop_is_expr);

        /* generate the PTRCALLPROP or PTRGETPROPDATA */
        if (G_cg->is_speculative())
        {
            /* speculative - use the data-only property evaluation */
            G_cg->write_op(OPC_PTRGETPROPDATA);
        }
        else
        {
            /* 
             *   if we have a varargs list, modify the call instruction
             *   that follows to make it a varargs call 
             */
            if (varargs)
            {
                /* swap to get the arg counter back on top */
                G_cg->write_op(OPC_SWAP);
                
                /* write the varargs modifier */
                G_cg->write_op(OPC_VARARGC);
            }
            
            /* normal - call the property */
            G_cg->write_op(OPC_PTRCALLPROP);
            G_cs->write((int)argc);
        }

        /* ptrcallprop removes the arguments, the object, and the property */
        G_cg->note_pop(argc + 2);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if they want the result, push it onto the stack */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}